

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O1

size_t __thiscall choc::value::Type::ComplexArray::getValueDataSize(ComplexArray *this)

{
  byte bVar1;
  uint uVar2;
  RepeatedGroup *pRVar3;
  ulong uVar4;
  size_t sVar5;
  RepeatedGroup *pRVar6;
  size_t sVar7;
  uint32_t *puVar8;
  
  uVar4 = (ulong)(this->groups).size;
  if (uVar4 == 0) {
    sVar7 = 0;
  }
  else {
    pRVar3 = (this->groups).items;
    sVar7 = 0;
    puVar8 = &(pRVar3->elementType).content.primitiveArray.numVectorElements;
    do {
      uVar2 = puVar8[-6];
      bVar1 = *(byte *)(puVar8 + -4);
      sVar5 = 4;
      if (bVar1 < 0x24) {
        switch(bVar1) {
        case 0:
          sVar5 = 0;
          break;
        case 1:
          sVar5 = 1;
          break;
        case 2:
        case 3:
        case 5:
        case 6:
        case 7:
switchD_001ea5c0_caseD_2:
          throwError("Invalid type");
        case 4:
          break;
        case 8:
switchD_001ea5c0_caseD_8:
          sVar5 = 8;
          break;
        default:
          if (bVar1 != 0x14) {
            if (bVar1 != 0x18) goto switchD_001ea5c0_caseD_2;
            goto switchD_001ea5c0_caseD_8;
          }
        }
      }
      else if (bVar1 < 0x40) {
        if (bVar1 != 0x24) {
          if (bVar1 != 0x30) goto switchD_001ea5c0_caseD_2;
          sVar5 = (ulong)puVar8[-1] * (ulong)(((PrimitiveArray *)(puVar8 + -2))->elementType & 0xf);
        }
      }
      else if (bVar1 == 0x40) {
        sVar5 = (ulong)puVar8[-1] *
                (ulong)((*puVar8 + (uint)(*puVar8 == 0)) *
                       (((PrimitiveArray *)(puVar8 + -2))->elementType & 0xf));
      }
      else if (bVar1 == 0x80) {
        sVar5 = getValueDataSize(*(ComplexArray **)(puVar8 + -2));
      }
      else {
        if (bVar1 != 0x90) goto switchD_001ea5c0_caseD_2;
        sVar5 = Object::getValueDataSize(*(Object **)(puVar8 + -2));
      }
      sVar7 = sVar7 + uVar2 * sVar5;
      pRVar6 = (RepeatedGroup *)(puVar8 + 4);
      puVar8 = puVar8 + 10;
    } while (pRVar6 != pRVar3 + uVar4);
  }
  return sVar7;
}

Assistant:

ObjectType* end() const                     { return items + size; }